

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O3

void __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::
~TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}